

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_fma::forwardDilation_x86
          (Convolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t _elemsize;
  _func_int *p_Var7;
  size_t sVar8;
  void *pvVar9;
  size_t sVar10;
  _func_int **pp_Var11;
  Layer *pLVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int *piVar16;
  int j;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  Allocator *pAVar20;
  ulong uVar21;
  long lVar22;
  int _w;
  int iVar23;
  int _w_00;
  ulong uVar24;
  ulong uVar25;
  undefined4 *puVar26;
  int iVar27;
  long lVar28;
  Allocator *pAVar29;
  ulong uVar30;
  undefined4 *puVar31;
  int j_1;
  long lVar32;
  int _w_01;
  ulong uVar33;
  undefined4 *puVar34;
  long local_1c0;
  long local_1b8;
  long local_180;
  long local_160;
  Mat local_118;
  Mat local_c8;
  Option opt_g;
  
  iVar2 = bottom_blob->w;
  iVar3 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  p_Var7 = this->_vptr_Convolution_x86_fma[-3];
  iVar4 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var7);
  iVar5 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var7);
  uVar6 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var7);
  iVar23 = (iVar4 + -1) * uVar6 + 1;
  iVar13 = (iVar2 - iVar23) / iVar5;
  _w = iVar13 + 1;
  Mat::create(top_blob,_w,(iVar3 - iVar23) / iVar5 + 1,
              *(int *)((long)&(this->weight_winograd23_data).dims + (long)p_Var7),_elemsize,
              opt->blob_allocator);
  iVar23 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_c8.cstep = 0;
    local_118.data = (Allocator *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_c8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
    local_118.elempack = 0;
    local_118.cstep = 0;
    uVar24 = 0;
    if (0 < (int)uVar6) {
      uVar24 = (ulong)uVar6;
    }
    local_1b8 = 0;
    local_1c0 = 0;
    local_118.elemsize = local_c8.elemsize;
    local_118.allocator = (Allocator *)local_118.data;
    local_118.dims = (int)local_118.refcount;
    local_118.w = local_118.refcount._4_4_;
    local_118._48_8_ = local_c8.elemsize;
    local_118.c = local_118.elempack;
    local_c8.data = local_118.data;
    local_c8.refcount._0_4_ = (int)local_118.refcount;
    local_c8.refcount._4_4_ = local_118.refcount._4_4_;
    local_c8.elempack = local_118.elempack;
    local_c8.allocator = (Allocator *)local_118.data;
    local_c8.dims = (int)local_118.refcount;
    local_c8.w = local_118.refcount._4_4_;
    local_c8._48_8_ = local_c8.elemsize;
    local_c8.c = local_118.elempack;
    for (uVar19 = 0; uVar19 != uVar24; uVar19 = uVar19 + 1) {
      local_180 = local_1b8;
      local_160 = local_1c0;
      for (uVar18 = 0; uVar18 != uVar6; uVar18 = uVar18 + 1) {
        uVar33 = (long)(int)((uVar6 + iVar2 + -1) - (int)uVar18) / (long)(int)uVar6;
        uVar21 = (long)(int)((uVar6 + iVar3 + -1) - (int)uVar19) / (long)(int)uVar6;
        _w_01 = (int)uVar33;
        iVar23 = (_w_01 - iVar4) / iVar5;
        iVar27 = (int)uVar21;
        iVar14 = (iVar27 - iVar4) / iVar5;
        Mat::create(&local_c8,_w_01,iVar27,bottom_blob->c,_elemsize,opt->workspace_allocator);
        if (((Allocator *)local_c8.data == (Allocator *)0x0) ||
           ((long)local_c8.c * local_c8.cstep == 0)) {
LAB_001ff84b:
          iVar23 = -100;
          goto LAB_001ff84f;
        }
        _w_00 = iVar23 + 1;
        Mat::create(&local_118,_w_00,iVar14 + 1,
                    *(int *)((long)&(this->weight_winograd23_data).dims +
                            (long)this->_vptr_Convolution_x86_fma[-3]),_elemsize,
                    opt->workspace_allocator);
        if (((Allocator *)local_118.data == (Allocator *)0x0) ||
           ((long)local_118.c * local_118.cstep == 0)) goto LAB_001ff84b;
        uVar33 = uVar33 & 0xffffffff;
        if (_w_01 < 1) {
          uVar33 = 0;
        }
        uVar21 = uVar21 & 0xffffffff;
        if (iVar27 < 1) {
          uVar21 = 0;
        }
        uVar15 = bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar15 = 0;
        }
        pAVar20 = (Allocator *)local_c8.data;
        for (uVar25 = 0; uVar25 != uVar15; uVar25 = uVar25 + 1) {
          sVar8 = bottom_blob->cstep;
          pvVar9 = bottom_blob->data;
          sVar10 = bottom_blob->elemsize;
          iVar27 = 0;
          pAVar29 = pAVar20;
          for (uVar30 = 0; uVar30 != uVar21; uVar30 = uVar30 + 1) {
            puVar26 = (undefined4 *)
                      ((long)pvVar9 + (long)iVar27 * 4 + sVar8 * sVar10 * uVar25 + local_160);
            for (uVar17 = 0; uVar33 != uVar17; uVar17 = uVar17 + 1) {
              *(undefined4 *)((long)&pAVar29->_vptr_Allocator + uVar17 * 4) = *puVar26;
              puVar26 = puVar26 + (int)uVar6;
            }
            pAVar29 = (Allocator *)((long)&pAVar29->_vptr_Allocator + (long)_w_01 * 4);
            iVar27 = iVar27 + uVar6 * iVar2;
          }
          pAVar20 = (Allocator *)
                    ((long)&pAVar20->_vptr_Allocator + local_c8.cstep * local_c8.elemsize);
        }
        auVar1[0] = opt->lightmode;
        auVar1._1_3_ = *(undefined3 *)&opt->field_0x1;
        auVar1._4_4_ = opt->num_threads;
        auVar1._8_8_ = opt->blob_allocator;
        auVar1._16_8_ = opt->workspace_allocator;
        auVar1._24_4_ = opt->openmp_blocktime;
        auVar1[0x1c] = opt->use_winograd_convolution;
        auVar1[0x1d] = opt->use_sgemm_convolution;
        auVar1[0x1e] = opt->use_int8_inference;
        auVar1[0x1f] = opt->use_vulkan_compute;
        opt_g.use_bf16_storage = opt->use_bf16_storage;
        opt_g.use_fp16_packed = opt->use_fp16_packed;
        opt_g.use_fp16_storage = opt->use_fp16_storage;
        opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_g.use_int8_packed = opt->use_int8_packed;
        opt_g.use_int8_storage = opt->use_int8_storage;
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g.use_shader_pack8 = opt->use_shader_pack8;
        opt_g.use_subgroup_basic = opt->use_subgroup_basic;
        opt_g.use_subgroup_vote = opt->use_subgroup_vote;
        opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_g.use_image_storage = opt->use_image_storage;
        opt_g.use_tensor_storage = opt->use_tensor_storage;
        opt_g.use_reserved_0 = opt->use_reserved_0;
        opt_g.flush_denormals = opt->flush_denormals;
        opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_g.use_shader_local_memory = opt->use_shader_local_memory;
        opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_g.use_reserved_7 = opt->use_reserved_7;
        opt_g.use_reserved_8 = opt->use_reserved_8;
        opt_g.use_reserved_9 = opt->use_reserved_9;
        opt_g.use_reserved_10 = opt->use_reserved_10;
        opt_g.use_reserved_11 = opt->use_reserved_11;
        opt_g._0_8_ = auVar1._0_8_;
        opt_g.blob_allocator = local_118.allocator;
        opt_g.workspace_allocator = (Allocator *)auVar1._16_8_;
        opt_g.openmp_blocktime = auVar1._24_4_;
        opt_g.use_winograd_convolution = (bool)auVar1[0x1c];
        opt_g.use_sgemm_convolution = (bool)auVar1[0x1d];
        opt_g.use_int8_inference = (bool)auVar1[0x1e];
        opt_g.use_vulkan_compute = (bool)auVar1[0x1f];
        (*this->convolution_dilation1->_vptr_Layer[7])
                  (this->convolution_dilation1,&local_c8,&local_118,&opt_g);
        pp_Var11 = this->_vptr_Convolution_x86_fma;
        sVar8 = top_blob->cstep;
        puVar26 = (undefined4 *)((long)top_blob->data + local_180);
        sVar10 = top_blob->elemsize;
        for (lVar28 = 0;
            lVar28 < *(int *)((long)&(this->weight_winograd23_data).dims + (long)pp_Var11[-3]);
            lVar28 = lVar28 + 1) {
          pAVar20 = (Allocator *)
                    ((long)(_func_int ***)local_118.data +
                    local_118.cstep * local_118.elemsize * lVar28);
          puVar31 = puVar26;
          for (lVar22 = 0; lVar22 <= iVar14; lVar22 = lVar22 + 1) {
            puVar34 = puVar31;
            for (lVar32 = 0; lVar32 <= iVar23; lVar32 = lVar32 + 1) {
              *puVar34 = *(undefined4 *)((long)&pAVar20->_vptr_Allocator + lVar32 * 4);
              puVar34 = puVar34 + (int)uVar6;
            }
            pAVar20 = (Allocator *)((long)&pAVar20->_vptr_Allocator + (long)_w_00 * 4);
            puVar31 = puVar31 + (int)(_w * uVar6);
          }
          puVar26 = (undefined4 *)((long)puVar26 + sVar8 * sVar10);
        }
        local_160 = local_160 + 4;
        local_180 = local_180 + 4;
      }
      local_1c0 = local_1c0 + (long)iVar2 * 4;
      local_1b8 = local_1b8 + (long)iVar13 * 4 + 4;
    }
    pLVar12 = this->activation;
    iVar23 = 0;
    if (pLVar12 != (Layer *)0x0) {
      (*pLVar12->_vptr_Layer[9])(pLVar12,top_blob,opt);
    }
LAB_001ff84f:
    piVar16 = (int *)CONCAT44(local_118.refcount._4_4_,(int)local_118.refcount);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          free(local_118.data);
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar16 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          free(local_c8.data);
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar23;
}

Assistant:

int Convolution_x86_fma::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}